

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Ireduce_scatter
              (void *sendbuf,void *recvbuf,int *recvcounts,MPIABI_Datatype datatype,MPIABI_Op op,
              MPIABI_Comm comm,MPIABI_Request *request)

{
  int iVar1;
  
  iVar1 = MPI_Ireduce_scatter();
  return iVar1;
}

Assistant:

int MPIABI_Ireduce_scatter(
  const void * sendbuf,
  void * recvbuf,
  const int * recvcounts,
  MPIABI_Datatype datatype,
  MPIABI_Op op,
  MPIABI_Comm comm,
  MPIABI_Request * request
) {
  return MPI_Ireduce_scatter(
    sendbuf,
    recvbuf,
    recvcounts,
    (MPI_Datatype)(WPI_Datatype)datatype,
    (MPI_Op)(WPI_Op)op,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}